

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ObtainSourceDataInstance
          (RTPSources *this,uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)

{
  RTPMemoryManager *pRVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 extraout_var;
  RTPInternalSourceData *this_00;
  undefined4 extraout_var_00;
  HashElement *pHVar4;
  HashElement *pHVar5;
  int index;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar6 = ssrc % 0x207d;
  pHVar4 = (this->sourcelist).table[uVar6];
  (this->sourcelist).curhashelem = pHVar4;
  bVar8 = false;
  do {
    pHVar5 = pHVar4;
    if (pHVar5 == (HashElement *)0x0) goto LAB_0011df52;
    pHVar4 = pHVar5;
    bVar7 = true;
    if (pHVar5->key != ssrc) {
      pHVar4 = pHVar5->hashnext;
      (this->sourcelist).curhashelem = pHVar4;
      bVar7 = bVar8;
    }
    bVar8 = bVar7;
  } while (!bVar7);
  if (pHVar5 != (HashElement *)0x0) {
    *srcdat = ((this->sourcelist).curhashelem)->element;
    *created = false;
    return 0;
  }
LAB_0011df52:
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    this_00 = (RTPInternalSourceData *)operator_new(0x280);
  }
  else {
    iVar3 = (*pRVar1->_vptr_RTPMemoryManager[2])(pRVar1,0x280,0x18);
    this_00 = (RTPInternalSourceData *)CONCAT44(extraout_var,iVar3);
  }
  RTPInternalSourceData::RTPInternalSourceData
            (this_00,ssrc,this->probationtype,(this->super_RTPMemoryObject).mgr);
  pHVar4 = (this->sourcelist).table[uVar6];
  if (pHVar4 != (HashElement *)0x0) {
    bVar8 = false;
    do {
      if (pHVar4->key == ssrc) {
        bVar8 = true;
      }
      else {
        pHVar4 = pHVar4->hashnext;
      }
    } while ((!bVar8) && (pHVar4 != (HashElement *)0x0));
    if (bVar8) {
      iVar3 = -9;
      bVar8 = true;
      goto LAB_0011e054;
    }
  }
  pRVar1 = (this->sourcelist).super_RTPMemoryObject.mgr;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    pHVar4 = (HashElement *)operator_new(0x30);
  }
  else {
    iVar3 = (*pRVar1->_vptr_RTPMemoryManager[2])
                      (pRVar1,0x30,(ulong)(uint)(this->sourcelist).memorytype);
    pHVar4 = (HashElement *)CONCAT44(extraout_var_00,iVar3);
  }
  pHVar4->key = ssrc;
  pHVar4->element = this_00;
  pHVar4->hashprev = (HashElement *)0x0;
  pHVar4->hashnext = (HashElement *)0x0;
  pHVar4->listprev = (HashElement *)0x0;
  pHVar4->listnext = (HashElement *)0x0;
  pHVar4->hashindex = uVar6;
  pHVar5 = (this->sourcelist).table[uVar6];
  (this->sourcelist).table[uVar6] = pHVar4;
  pHVar4->hashnext = pHVar5;
  if (pHVar5 != (HashElement *)0x0) {
    pHVar5->hashprev = pHVar4;
  }
  if ((this->sourcelist).firsthashelem == (HashElement *)0x0) {
    (this->sourcelist).firsthashelem = pHVar4;
  }
  else {
    pHVar5 = (this->sourcelist).lasthashelem;
    pHVar5->listnext = pHVar4;
    pHVar4->listprev = pHVar5;
  }
  (this->sourcelist).lasthashelem = pHVar4;
  bVar8 = false;
  iVar3 = 0;
LAB_0011e054:
  if (!bVar8) {
    *srcdat = this_00;
    *created = true;
    this->totalcount = this->totalcount + 1;
    return 0;
  }
  pRVar1 = (this->super_RTPMemoryObject).mgr;
  pp_Var2 = (this_00->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject;
  if (pRVar1 == (RTPMemoryManager *)0x0) {
    (*pp_Var2[1])(this_00);
    return iVar3;
  }
  (**pp_Var2)(this_00);
  (*pRVar1->_vptr_RTPMemoryManager[3])(pRVar1,this_00);
  return iVar3;
}

Assistant:

int RTPSources::ObtainSourceDataInstance(uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)
{
	RTPInternalSourceData *srcdat2;
	int status;
	
	if (sourcelist.GotoElement(ssrc) < 0) // No entry for this source
	{
#ifdef RTP_SUPPORT_PROBATION
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,probationtype,GetMemoryManager());
#else
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,RTPSources::NoProbation,GetMemoryManager());
#endif // RTP_SUPPORT_PROBATION
		if (srcdat2 == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = sourcelist.AddElement(ssrc,srcdat2)) < 0)
		{
			RTPDelete(srcdat2,GetMemoryManager());
			return status;
		}
		*srcdat = srcdat2;
		*created = true;
		totalcount++;
	}
	else
	{
		*srcdat = sourcelist.GetCurrentElement();
		*created = false;
	}
	return 0;
}